

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_coords(_glist *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_float tVar2;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  _glist *x_local;
  
  iVar1 = glist_getzoom(x);
  x->gl_zoom = iVar1;
  tVar2 = atom_getfloatarg(0,argc,argv);
  x->gl_x1 = tVar2;
  tVar2 = atom_getfloatarg(1,argc,argv);
  x->gl_y1 = tVar2;
  tVar2 = atom_getfloatarg(2,argc,argv);
  x->gl_x2 = tVar2;
  tVar2 = atom_getfloatarg(3,argc,argv);
  x->gl_y2 = tVar2;
  tVar2 = atom_getfloatarg(4,argc,argv);
  x->gl_pixwidth = (int)tVar2;
  tVar2 = atom_getfloatarg(5,argc,argv);
  x->gl_pixheight = (int)tVar2;
  if (argc < 8) {
    tVar2 = atom_getfloatarg(6,argc,argv);
    canvas_setgraph(x,(int)tVar2,1);
  }
  else {
    tVar2 = atom_getfloatarg(7,argc,argv);
    x->gl_xmargin = (int)tVar2;
    tVar2 = atom_getfloatarg(8,argc,argv);
    x->gl_ymargin = (int)tVar2;
    tVar2 = atom_getfloatarg(6,argc,argv);
    canvas_setgraph(x,(int)tVar2,0);
  }
  return;
}

Assistant:

static void canvas_coords(t_glist *x, t_symbol *s, int argc, t_atom *argv)
{
          /* FIXME: this is a stopgap - we should always be using
            glist_getzoom() and never gl_zoom in rest of code. */
    x->gl_zoom = glist_getzoom(x);
    x->gl_x1 = atom_getfloatarg(0, argc, argv);
    x->gl_y1 = atom_getfloatarg(1, argc, argv);
    x->gl_x2 = atom_getfloatarg(2, argc, argv);
    x->gl_y2 = atom_getfloatarg(3, argc, argv);
    x->gl_pixwidth = atom_getfloatarg(4, argc, argv);
    x->gl_pixheight = atom_getfloatarg(5, argc, argv);
    if (argc <= 7)
        canvas_setgraph(x, atom_getfloatarg(6, argc, argv), 1);
    else
    {
        x->gl_xmargin = atom_getfloatarg(7, argc, argv);
        x->gl_ymargin = atom_getfloatarg(8, argc, argv);
        canvas_setgraph(x, atom_getfloatarg(6, argc, argv), 0);
    }
}